

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setTestToRunUsingVerboseOutput_TestShell::
TEST_CommandLineArguments_setTestToRunUsingVerboseOutput_TestShell
          (TEST_CommandLineArguments_setTestToRunUsingVerboseOutput_TestShell *this)

{
  TEST_CommandLineArguments_setTestToRunUsingVerboseOutput_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_CommandLineArguments_setTestToRunUsingVerboseOutput_TestShell_003cc1c8;
  return;
}

Assistant:

TEST(CommandLineArguments, setTestToRunUsingVerboseOutput)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "TEST(testgroup, testname) - stuff" };
    CHECK(newArgumentParser(argc, argv));

    TestFilter nameFilter("testname");
    TestFilter groupFilter("testgroup");
    nameFilter.strictMatching();
    groupFilter.strictMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
}